

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_with(REF_CELL ref_cell,REF_INT *nodes,REF_INT *cell)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  REF_INT cell_00;
  REF_INT ncandidate;
  REF_INT ntarget;
  REF_INT candidate [27];
  REF_INT target [27];
  REF_INT orig [27];
  uint local_198;
  uint local_194;
  REF_INT *local_190;
  REF_INT local_188 [28];
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  *cell = -1;
  uVar3 = ref_sort_unique_int(ref_cell->node_per,nodes,(REF_INT *)&local_194,local_118);
  if (uVar3 == 0) {
    iVar1 = *nodes;
    uVar5 = 0xffffffff;
    if (-1 < (long)iVar1) {
      uVar5 = 0xffffffff;
      if (iVar1 < ref_cell->ref_adj->nnode) {
        uVar5 = (ulong)(uint)ref_cell->ref_adj->first[iVar1];
      }
    }
    if ((int)uVar5 != -1) {
      cell_00 = ref_cell->ref_adj->item[(int)uVar5].ref;
      local_190 = cell;
      do {
        uVar3 = ref_cell_nodes(ref_cell,cell_00,local_a8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x4a9,"ref_cell_with",(ulong)uVar3,"get orig");
          return uVar3;
        }
        uVar3 = ref_sort_unique_int(ref_cell->node_per,local_a8,(REF_INT *)&local_198,local_188);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x4ac,"ref_cell_with",(ulong)uVar3,"canonical");
          return uVar3;
        }
        if (local_194 == local_198) {
          if ((int)local_194 < 1) {
            uVar3 = 0;
          }
          else {
            uVar4 = 0;
            uVar3 = 0;
            do {
              uVar3 = uVar3 + (local_118[uVar4] == local_188[uVar4]);
              uVar4 = uVar4 + 1;
            } while (local_194 != uVar4);
          }
          if (local_194 == uVar3) {
            *local_190 = cell_00;
            return 0;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        iVar1 = pRVar2[(int)uVar5].next;
        uVar5 = (ulong)iVar1;
        if (uVar5 == 0xffffffffffffffff) {
          cell_00 = -1;
        }
        else {
          cell_00 = pRVar2[uVar5].ref;
        }
      } while (iVar1 != -1);
    }
    uVar3 = 5;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x4a6,
           "ref_cell_with",(ulong)uVar3,"canonical");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with(REF_CELL ref_cell, REF_INT *nodes,
                                 REF_INT *cell) {
  REF_INT item, ref, node, same;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell) = REF_EMPTY;

  RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), nodes, &ntarget, target),
      "canonical");

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), nodes[0], item, ref) {
    RSS(ref_cell_nodes(ref_cell, ref, orig), "get orig");
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), orig, &ncandidate,
                            candidate),
        "canonical");
    if (ntarget == ncandidate) {
      same = 0;
      for (node = 0; node < ntarget; node++)
        if (target[node] == candidate[node]) same++;
      if (ntarget == same) {
        (*cell) = ref;
        return REF_SUCCESS;
      }
    }
  }

  return REF_NOT_FOUND;
}